

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::InnerMap::iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::KeyValuePair>,_bool>
* __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::InnerMap
::insert(pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::InnerMap::iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::KeyValuePair>,_bool>
         *__return_storage_ptr__,InnerMap *this,KeyValuePair *kv)

{
  unsigned_long b;
  bool bVar1;
  Node *node;
  pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::InnerMap::iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::KeyValuePair>,_unsigned_long>
  p;
  pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::InnerMap::iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::KeyValuePair>,_unsigned_long>
  local_48;
  
  FindHelper(&p,this,&kv->k_);
  if (p.first.node_ == (Node *)0x0) {
    bVar1 = ResizeIfLoadIsOutOfRange(this,this->num_elements_ + 1);
    if (bVar1) {
      FindHelper(&local_48,this,&kv->k_);
      p.first.bucket_index_ = local_48.first.bucket_index_;
      p.first.node_ = local_48.first.node_;
      p.first.m_ = local_48.first.m_;
      p.second = local_48.second;
    }
    b = p.second;
    node = Map<std::__cxx11::string,long>::InnerMap::
           Alloc<google::protobuf::Map<std::__cxx11::string,long>::InnerMap::Node>
                     ((InnerMap *)this,1);
    KeyValuePair::KeyValuePair(&node->kv,kv);
    InsertUnique(&__return_storage_ptr__->first,this,b,node);
    this->num_elements_ = this->num_elements_ + 1;
    bVar1 = true;
  }
  else {
    (__return_storage_ptr__->first).node_ = p.first.node_;
    (__return_storage_ptr__->first).m_ = p.first.m_;
    (__return_storage_ptr__->first).bucket_index_ = p.first.bucket_index_;
    bVar1 = false;
  }
  __return_storage_ptr__->second = bVar1;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> insert(const KeyValuePair& kv) {
      std::pair<const_iterator, size_type> p = FindHelper(kv.key());
      // Case 1: key was already present.
      if (p.first.node_ != NULL)
        return std::make_pair(iterator(p.first), false);
      // Case 2: insert.
      if (ResizeIfLoadIsOutOfRange(num_elements_ + 1)) {
        p = FindHelper(kv.key());
      }
      const size_type b = p.second;  // bucket number
      Node* node = Alloc<Node>(1);
      alloc_.construct(&node->kv, kv);
      iterator result = InsertUnique(b, node);
      ++num_elements_;
      return std::make_pair(result, true);
    }